

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_19cdc37::ResizeTest::~ResizeTest(ResizeTest *this)

{
  pointer pFVar1;
  pointer pcVar2;
  
  (this->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__ResizeTest_01045920;
  (this->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__ResizeTest_01045970;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__ResizeTest_01045990;
  pFVar1 = (this->frame_info_list_).
           super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1);
  }
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_0103d9f8;
  pcVar2 = (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_EncoderTest).stats_.buffer_.field_2) {
    operator_delete(pcVar2);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~ResizeTest() override = default;